

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# touzet_ted_test.cc
# Opt level: O3

int main(void)

{
  int iVar1;
  reference_wrapper<node::Node<label::StringLabel>_> *prVar2;
  char cVar3;
  char cVar4;
  bool bVar5;
  istream *piVar6;
  ostream *poVar7;
  int *piVar8;
  long lVar9;
  long *plVar10;
  undefined8 uVar11;
  string line;
  string destination_tree;
  string source_tree;
  CostModel ucm;
  Node<label::StringLabel> t2;
  Node<label::StringLabel> t1;
  BracketNotationParser<label::StringLabel> bnp;
  LabelDictionary ld;
  TouzetDepthPruningTruncatedTreeFixTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
  touzet_algorithm;
  ifstream test_cases_file;
  TreeIndexAll ti1;
  TreeIndexAll ti2;
  int local_d80;
  reference_wrapper<node::Node<label::StringLabel>_> *local_d78;
  long local_d70;
  reference_wrapper<node::Node<label::StringLabel>_> local_d68 [2];
  double local_d58;
  double local_d50;
  string local_d48;
  string local_d28;
  long local_d08;
  UnitCostModelLD<label::StringLabel> local_d00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cd8;
  Node<label::StringLabel> local_cb8;
  Node<label::StringLabel> local_c80;
  BracketNotationParser<label::StringLabel> local_c48;
  LabelDictionary<label::StringLabel> local_b88;
  TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll> local_b30;
  long local_ab8 [65];
  TreeIndexAll local_8b0;
  TreeIndexAll local_470;
  
  local_b88.label_to_id_dictionary_._M_h._M_buckets =
       &local_b88.label_to_id_dictionary_._M_h._M_single_bucket;
  local_b88.label_to_id_dictionary_._M_h._M_bucket_count = 1;
  local_b88.label_to_id_dictionary_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_b88.label_to_id_dictionary_._M_h._M_element_count = 0;
  local_b88.label_to_id_dictionary_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_b88.label_to_id_dictionary_._M_h._M_rehash_policy._M_next_resize = 0;
  local_b88.label_to_id_dictionary_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_b88.id_to_label_dictionary_.
  super__Vector_base<label::StringLabel,_std::allocator<label::StringLabel>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b88.id_to_label_dictionary_.
  super__Vector_base<label::StringLabel,_std::allocator<label::StringLabel>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  local_b88.id_to_label_dictionary_.
  super__Vector_base<label::StringLabel,_std::allocator<label::StringLabel>_>._M_impl.
  super__Vector_impl_data._M_finish._4_4_ = 0;
  local_b88.id_to_label_dictionary_.
  super__Vector_base<label::StringLabel,_std::allocator<label::StringLabel>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  local_b88._76_8_ = 0;
  local_d00.ld_ = &local_b88;
  std::ifstream::ifstream(local_ab8,"touzet_ted_test_data.txt",_S_in);
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Error while opening file.",0x19);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x18);
    std::ostream::put(-0x18);
    local_d80 = -1;
    std::ostream::flush();
  }
  else {
    local_b30.
    super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>.c_ =
         &local_d00;
    local_b30.td_.super_Matrix<double>.data_.super__Vector_base<double,_std::allocator<double>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_b30.td_.super_Matrix<double>.data_.super__Vector_base<double,_std::allocator<double>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b30.td_.super_Matrix<double>.data_.super__Vector_base<double,_std::allocator<double>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_b30.fd_.super_Matrix<double>.data_.super__Vector_base<double,_std::allocator<double>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_b30.fd_.super_Matrix<double>.data_.super__Vector_base<double,_std::allocator<double>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b30.fd_.super_Matrix<double>.data_.super__Vector_base<double,_std::allocator<double>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_b30.
    super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>.
    _vptr_TEDAlgorithm = (_func_int **)&PTR_ted_0010dd00;
    local_8b0.super_PreLToTypeLeft.prel_to_type_left_.super__Bvector_base<std::allocator<bool>_>.
    _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_8b0.super_PreLToTypeLeft.prel_to_type_left_.super__Bvector_base<std::allocator<bool>_>.
    _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
    local_8b0.super_PreLToTypeRight.prel_to_type_right_.super__Bvector_base<std::allocator<bool>_>.
    _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_8b0.super_PreLToTypeRight.prel_to_type_right_.super__Bvector_base<std::allocator<bool>_>.
    _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
    memset(&local_8b0.super_PreLToLabelId,0,0x27c);
    local_8b0.super_PreLToTypeLeft.prel_to_type_left_.super__Bvector_base<std::allocator<bool>_>.
    _M_impl.super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
    local_8b0.super_PreLToTypeRight.prel_to_type_right_.super__Bvector_base<std::allocator<bool>_>.
    _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_8b0.super_PreLToTypeRight.prel_to_type_right_.super__Bvector_base<std::allocator<bool>_>.
    _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
    memset((_Bit_pointer *)
           ((long)&local_8b0.super_PreLToTypeRight.prel_to_type_right_.
                   super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data +
           0x20),0,0xb0);
    local_8b0.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h._M_bucket_count
         = 1;
    local_8b0.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h._M_before_begin
    ._M_nxt = (_Hash_node_base *)0x0;
    local_8b0.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h.
    _M_element_count = 0;
    local_8b0.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h.
    _M_rehash_policy._M_max_load_factor = 1.0;
    local_8b0.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h._M_buckets =
         &local_8b0.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h.
          _M_single_bucket;
    memset(&local_8b0.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h.
            _M_rehash_policy._M_next_resize,0,0xa0);
    local_470.super_PreLToTypeLeft.prel_to_type_left_.super__Bvector_base<std::allocator<bool>_>.
    _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_470.super_PreLToTypeLeft.prel_to_type_left_.super__Bvector_base<std::allocator<bool>_>.
    _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
    local_470.super_PreLToTypeRight.prel_to_type_right_.super__Bvector_base<std::allocator<bool>_>.
    _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_470.super_PreLToTypeRight.prel_to_type_right_.super__Bvector_base<std::allocator<bool>_>.
    _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
    memset(&local_470.super_PreLToLabelId,0,0x27c);
    local_470.super_PreLToTypeLeft.prel_to_type_left_.super__Bvector_base<std::allocator<bool>_>.
    _M_impl.super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
    local_470.super_PreLToTypeRight.prel_to_type_right_.super__Bvector_base<std::allocator<bool>_>.
    _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_470.super_PreLToTypeRight.prel_to_type_right_.super__Bvector_base<std::allocator<bool>_>.
    _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
    memset((_Bit_pointer *)
           ((long)&local_470.super_PreLToTypeRight.prel_to_type_right_.
                   super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data +
           0x20),0,0xb0);
    local_470.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h._M_bucket_count
         = 1;
    local_470.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h._M_before_begin
    ._M_nxt = (_Hash_node_base *)0x0;
    local_470.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h.
    _M_element_count = 0;
    local_470.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h.
    _M_rehash_policy._M_max_load_factor = 1.0;
    local_470.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h._M_buckets =
         &local_470.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h.
          _M_single_bucket;
    memset(&local_470.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h.
            _M_rehash_policy._M_next_resize,0,0xa0);
    local_d78 = local_d68;
    local_d80 = 0;
    local_d70 = 0;
    local_d68[0]._M_data._0_1_ = 0;
    do {
      do {
        cVar3 = (char)(istream *)local_ab8;
        cVar4 = std::ios::widen((char)*(undefined8 *)(local_ab8[0] + -0x18) + cVar3);
        piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)local_ab8,(string *)&local_d78,cVar4);
        if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) {
          local_d80 = 0;
          goto LAB_00103070;
        }
      } while (*(char *)&local_d78->_M_data != '#');
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"--- TEST ---",0xc);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
      std::ostream::put('\x10');
      std::ostream::flush();
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)local_d78,local_d70);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      cVar4 = std::ios::widen((char)*(undefined8 *)(local_ab8[0] + -0x18) + cVar3);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_ab8,(string *)&local_d78,cVar4);
      local_d28._M_dataplus._M_p = (pointer)&local_d28.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d28,local_d78,(long)&local_d78->_M_data + local_d70);
      cVar4 = std::ios::widen((char)*(undefined8 *)(local_ab8[0] + -0x18) + cVar3);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_ab8,(string *)&local_d78,cVar4);
      local_d48._M_dataplus._M_p = (pointer)&local_d48.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d48,local_d78,(long)&local_d78->_M_data + local_d70);
      cVar4 = std::ios::widen((char)*(undefined8 *)(local_ab8[0] + -0x18) + cVar3);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_ab8,(string *)&local_d78,cVar4);
      prVar2 = local_d78;
      piVar8 = __errno_location();
      iVar1 = *piVar8;
      *piVar8 = 0;
      lVar9 = strtol((char *)prVar2,(char **)&local_c48,10);
      if (local_c48.node_stack.
          super__Vector_base<std::reference_wrapper<node::Node<label::StringLabel>_>,_std::allocator<std::reference_wrapper<node::Node<label::StringLabel>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start == prVar2) {
        std::__throw_invalid_argument("stoi");
LAB_00103136:
        std::__throw_out_of_range("stoi");
LAB_00103142:
        std::__throw_invalid_argument("stod");
LAB_0010314e:
        uVar11 = std::__throw_out_of_range("stod");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_cd8._M_dataplus._M_p != &local_cd8.field_2) {
          operator_delete(local_cd8._M_dataplus._M_p,local_cd8.field_2._M_allocated_capacity + 1);
        }
        node::Node<label::StringLabel>::~Node(&local_cb8);
        node::Node<label::StringLabel>::~Node(&local_c80);
        parser::BracketNotationParser<label::StringLabel>::~BracketNotationParser(&local_c48);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d48._M_dataplus._M_p != &local_d48.field_2) {
          operator_delete(local_d48._M_dataplus._M_p,local_d48.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d28._M_dataplus._M_p != &local_d28.field_2) {
          operator_delete(local_d28._M_dataplus._M_p,local_d28.field_2._M_allocated_capacity + 1);
        }
        if (local_d78 != local_d68) {
          operator_delete(local_d78,
                          CONCAT71(local_d68[0]._M_data._1_7_,local_d68[0]._M_data._0_1_) + 1);
        }
        node::TreeIndexAll::~TreeIndexAll(&local_470);
        node::TreeIndexAll::~TreeIndexAll(&local_8b0);
        ted::TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
        ::~TEDAlgorithmTouzet(&local_b30);
        std::ifstream::~ifstream(local_ab8);
        std::vector<label::StringLabel,_std::allocator<label::StringLabel>_>::~vector
                  (&local_b88.id_to_label_dictionary_);
        std::
        _Hashtable<label::StringLabel,_std::pair<const_label::StringLabel,_int>,_std::allocator<std::pair<const_label::StringLabel,_int>_>,_std::__detail::_Select1st,_std::equal_to<label::StringLabel>,_std::hash<label::StringLabel>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable((_Hashtable<label::StringLabel,_std::pair<const_label::StringLabel,_int>,_std::allocator<std::pair<const_label::StringLabel,_int>_>,_std::__detail::_Select1st,_std::equal_to<label::StringLabel>,_std::hash<label::StringLabel>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)&local_b88);
        _Unwind_Resume(uVar11);
      }
      if (((int)lVar9 != lVar9) || (*piVar8 == 0x22)) goto LAB_00103136;
      if (*piVar8 == 0) {
        *piVar8 = iVar1;
      }
      cVar3 = std::ios::widen((char)*(undefined8 *)(local_ab8[0] + -0x18) + cVar3);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_ab8,(string *)&local_d78,cVar3);
      prVar2 = local_d78;
      iVar1 = *piVar8;
      *piVar8 = 0;
      local_d50 = strtod((char *)local_d78,(char **)&local_c48);
      if (local_c48.node_stack.
          super__Vector_base<std::reference_wrapper<node::Node<label::StringLabel>_>,_std::allocator<std::reference_wrapper<node::Node<label::StringLabel>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start == prVar2) goto LAB_00103142;
      if (*piVar8 == 0) {
        *piVar8 = iVar1;
      }
      else if (*piVar8 == 0x22) goto LAB_0010314e;
      parser::BracketNotationParser<label::StringLabel>::BracketNotationParser(&local_c48);
      bVar5 = parser::BracketNotationParser<label::StringLabel>::validate_input
                        (&local_c48,&local_d28);
      if (bVar5) {
        local_d08 = lVar9;
        bVar5 = parser::BracketNotationParser<label::StringLabel>::validate_input
                          (&local_c48,&local_d48);
        if (!bVar5) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Incorrect format of input tree: \'",0x21);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,local_d48._M_dataplus._M_p,
                              local_d48._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,"\'. Is the number of opening and closing brackets equal?",0x37);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          goto LAB_00102eda;
        }
        parser::BracketNotationParser<label::StringLabel>::parse_single
                  (&local_c80,&local_c48,&local_d28);
        parser::BracketNotationParser<label::StringLabel>::parse_single
                  (&local_cb8,&local_c48,&local_d48);
        node::
        index_tree<node::TreeIndexAll,label::StringLabel,cost_model::UnitCostModelLD<label::StringLabel>>
                  (&local_8b0,&local_c80,&local_b88,&local_d00);
        node::
        index_tree<node::TreeIndexAll,label::StringLabel,cost_model::UnitCostModelLD<label::StringLabel>>
                  (&local_470,&local_cb8,&local_b88,&local_d00);
        local_d58 = ted::
                    TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                    ::ted_k((TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                             *)&local_b30,&local_8b0,&local_470,(int)local_d08);
        if ((local_d58 != local_d50) || (NAN(local_d58) || NAN(local_d50))) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Incorrect ted result:\n",0x16);
          __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                    (&local_cd8,vsnprintf,0x148,"%f",local_d58);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,local_cd8._M_dataplus._M_p,
                              local_cd8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\ninstead of\n",0xc);
          __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                    (&local_cf8,vsnprintf,0x148,"%f",local_d50);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,local_cf8._M_dataplus._M_p,local_cf8._M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_cf8._M_dataplus._M_p != &local_cf8.field_2) {
            operator_delete(local_cf8._M_dataplus._M_p,local_cf8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_cd8._M_dataplus._M_p != &local_cd8.field_2) {
            operator_delete(local_cd8._M_dataplus._M_p,local_cd8.field_2._M_allocated_capacity + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"for input trees: ",0x11);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,local_d28._M_dataplus._M_p,
                              local_d28._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," | ",3);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,local_d48._M_dataplus._M_p,local_d48._M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"and k: ",7);
          plVar10 = (long *)std::ostream::operator<<((ostream *)&std::cerr,(int)local_d08);
          std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
          std::ostream::put((char)plVar10);
          local_d80 = -1;
          std::ostream::flush();
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_cb8.label_.label_._M_dataplus._M_p != &local_cb8.label_.label_.field_2) {
          operator_delete(local_cb8.label_.label_._M_dataplus._M_p,
                          local_cb8.label_.label_.field_2._M_allocated_capacity + 1);
        }
        std::
        vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>::
        ~vector(&local_cb8.children_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c80.label_.label_._M_dataplus._M_p != &local_c80.label_.label_.field_2) {
          operator_delete(local_c80.label_.label_._M_dataplus._M_p,
                          local_c80.label_.label_.field_2._M_allocated_capacity + 1);
        }
        bVar5 = local_d58 == local_d50;
        std::
        vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>::
        ~vector(&local_c80.children_);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Incorrect format of input tree: \'",0x21);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,local_d28._M_dataplus._M_p,
                            local_d28._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,"\'. Is the number of opening and closing brackets equal?",0x37);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
LAB_00102eda:
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        local_d80 = -1;
        bVar5 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c48.kMatchRightBracket._M_dataplus._M_p != &local_c48.kMatchRightBracket.field_2)
      {
        operator_delete(local_c48.kMatchRightBracket._M_dataplus._M_p,
                        local_c48.kMatchRightBracket.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c48.kMatchLeftBracket._M_dataplus._M_p != &local_c48.kMatchLeftBracket.field_2) {
        operator_delete(local_c48.kMatchLeftBracket._M_dataplus._M_p,
                        local_c48.kMatchLeftBracket.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c48.kStructureElements._M_dataplus._M_p != &local_c48.kStructureElements.field_2)
      {
        operator_delete(local_c48.kStructureElements._M_dataplus._M_p,
                        local_c48.kStructureElements.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c48.kRightBracket._M_dataplus._M_p != &local_c48.kRightBracket.field_2) {
        operator_delete(local_c48.kRightBracket._M_dataplus._M_p,
                        local_c48.kRightBracket.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c48.kLeftBracket._M_dataplus._M_p != &local_c48.kLeftBracket.field_2) {
        operator_delete(local_c48.kLeftBracket._M_dataplus._M_p,
                        local_c48.kLeftBracket.field_2._M_allocated_capacity + 1);
      }
      if (local_c48.node_stack.
          super__Vector_base<std::reference_wrapper<node::Node<label::StringLabel>_>,_std::allocator<std::reference_wrapper<node::Node<label::StringLabel>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (reference_wrapper<node::Node<label::StringLabel>_> *)0x0) {
        operator_delete(local_c48.node_stack.
                        super__Vector_base<std::reference_wrapper<node::Node<label::StringLabel>_>,_std::allocator<std::reference_wrapper<node::Node<label::StringLabel>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_c48.node_stack.
                              super__Vector_base<std::reference_wrapper<node::Node<label::StringLabel>_>,_std::allocator<std::reference_wrapper<node::Node<label::StringLabel>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_c48.node_stack.
                              super__Vector_base<std::reference_wrapper<node::Node<label::StringLabel>_>,_std::allocator<std::reference_wrapper<node::Node<label::StringLabel>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d48._M_dataplus._M_p != &local_d48.field_2) {
        operator_delete(local_d48._M_dataplus._M_p,local_d48.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d28._M_dataplus._M_p != &local_d28.field_2) {
        operator_delete(local_d28._M_dataplus._M_p,local_d28.field_2._M_allocated_capacity + 1);
      }
    } while (bVar5);
LAB_00103070:
    if (local_d78 != local_d68) {
      operator_delete(local_d78,CONCAT71(local_d68[0]._M_data._1_7_,local_d68[0]._M_data._0_1_) + 1)
      ;
    }
    node::TreeIndexAll::~TreeIndexAll(&local_470);
    node::TreeIndexAll::~TreeIndexAll(&local_8b0);
    local_b30.
    super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>.
    _vptr_TEDAlgorithm = (_func_int **)&PTR_ted_0010dd80;
    if (local_b30.fd_.super_Matrix<double>.data_.super__Vector_base<double,_std::allocator<double>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b30.fd_.super_Matrix<double>.data_.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_b30.fd_.super_Matrix<double>.data_.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_b30.fd_.super_Matrix<double>.data_.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_b30.td_.super_Matrix<double>.data_.super__Vector_base<double,_std::allocator<double>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b30.td_.super_Matrix<double>.data_.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_b30.td_.super_Matrix<double>.data_.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_b30.td_.super_Matrix<double>.data_.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  std::ifstream::~ifstream(local_ab8);
  std::vector<label::StringLabel,_std::allocator<label::StringLabel>_>::~vector
            (&local_b88.id_to_label_dictionary_);
  std::
  _Hashtable<label::StringLabel,_std::pair<const_label::StringLabel,_int>,_std::allocator<std::pair<const_label::StringLabel,_int>_>,_std::__detail::_Select1st,_std::equal_to<label::StringLabel>,_std::hash<label::StringLabel>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<label::StringLabel,_std::pair<const_label::StringLabel,_int>,_std::allocator<std::pair<const_label::StringLabel,_int>_>,_std::__detail::_Select1st,_std::equal_to<label::StringLabel>,_std::hash<label::StringLabel>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&local_b88);
  return local_d80;
}

Assistant:

int main() {

  // Type aliases.
  using Label = label::StringLabel;
  using CostModel = cost_model::UnitCostModelLD<Label>;
  using LabelDictionary = label::LabelDictionary<Label>;
  
  // Initialise label dictionary - separate dictionary for each test tree
  // becuse it is easier to keep track of label ids.
  LabelDictionary ld;
  
  // Initialise cost model.
  CostModel ucm(ld);

  // Parse test cases from file.
  std::ifstream test_cases_file("touzet_ted_test_data.txt");
  if (!test_cases_file.is_open()) {
    std::cerr << "Error while opening file." << std::endl;
    return -1;
  }

  // Initialise Touzet's algorithm.
  ted::TouzetDepthPruningTruncatedTreeFixTreeIndex<CostModel, node::TreeIndexAll> touzet_algorithm(ucm);

  // Initialise two tree indexes.
  // Use TreeIndexAll that is a superset of all algorithms' indexes.
  node::TreeIndexAll ti1;
  node::TreeIndexAll ti2;

  for (std::string line; std::getline( test_cases_file, line);) {
    if (line[0] == '#') {
      std::cout << "--- TEST ---" << std::endl;
      std::cout << line << std::endl;
      
      std::getline(test_cases_file, line);
      std::string source_tree = line;
      std::getline(test_cases_file, line);
      std::string destination_tree = line;
      std::getline(test_cases_file, line);
      int k_value = std::stoi(line);
      
      std::getline(test_cases_file, line);
      double expected_result = std::stod(line);

      parser::BracketNotationParser<Label> bnp;

      // Validate test tree.
      if (!bnp.validate_input(source_tree)) {
        std::cerr << "Incorrect format of input tree: '" << source_tree << "'. Is the number of opening and closing brackets equal?" << std::endl;
        return -1;
      }
      // Validate test tree.
      if (!bnp.validate_input(destination_tree)) {
        std::cerr << "Incorrect format of input tree: '" << destination_tree << "'. Is the number of opening and closing brackets equal?" << std::endl;
        return -1;
      }
      // Parse test tree.
      node::Node<Label> t1 = bnp.parse_single(source_tree);
      node::Node<Label> t2 = bnp.parse_single(destination_tree);

      // Index input trees.
      node::index_tree(ti1, t1, ld, ucm);
      node::index_tree(ti2, t2, ld, ucm);

      // Execute the algorithm and get the result.
      double computed_result = touzet_algorithm.ted_k(ti1, ti2, k_value);

      if (computed_result != expected_result) {
        std::cerr << "Incorrect ted result:\n" << std::to_string(computed_result) << "\ninstead of\n" << std::to_string(expected_result) << std::endl;
        std::cerr << "for input trees: " << source_tree << " | " << destination_tree << std::endl;
        std::cerr << "and k: " << k_value << std::endl;
        return -1;
      }
    }
  }

  return 0;
}